

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

QSize __thiscall QSplitter::minimumSizeHint(QSplitter *this)

{
  long lVar1;
  long lVar2;
  QWidget *w;
  long *plVar3;
  QSize QVar4;
  ulong uVar5;
  Representation RVar6;
  Representation RVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  
  lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
  QWidget::ensurePolished((QWidget *)this);
  if (*(long *)(lVar1 + 0x298) == 0) {
    RVar6.m_i = 0;
    iVar10 = 0;
  }
  else {
    uVar9 = 0;
    iVar10 = 0;
    RVar6.m_i = 0;
    do {
      lVar2 = *(long *)(*(long *)(lVar1 + 0x290) + uVar9 * 8);
      if (((lVar2 != 0) && (w = *(QWidget **)(lVar2 + 0x18), w != (QWidget *)0x0)) &&
         ((w->data->widget_attributes & 0x10000) == 0)) {
        QVar4 = qSmartMinSize(w);
        RVar7.m_i = RVar6.m_i;
        if (((ulong)QVar4 & 0x8000000080000000) == 0) {
          RVar7.m_i = QVar4.ht.m_i.m_i;
          if (*(int *)(lVar1 + 0x2a0) == 1) {
            RVar7.m_i = QVar4.wd.m_i.m_i;
          }
          iVar10 = iVar10 + RVar7.m_i;
          RVar7.m_i = QVar4.ht.m_i.m_i;
          if (*(int *)(lVar1 + 0x2a0) == 2) {
            RVar7.m_i = QVar4.wd.m_i.m_i;
          }
          if (RVar7.m_i < RVar6.m_i) {
            RVar7.m_i = RVar6.m_i;
          }
        }
        plVar3 = *(long **)(lVar2 + 0x20);
        RVar6.m_i = RVar7.m_i;
        if (((plVar3 != (long *)0x0) && ((*(byte *)(plVar3[4] + 10) & 1) == 0)) &&
           (uVar5 = (**(code **)(*plVar3 + 0x70))(), (uVar5 & 0x8000000080000000) == 0)) {
          RVar6.m_i = (int)(uVar5 >> 0x20);
          iVar8 = RVar6.m_i;
          if (*(int *)(lVar1 + 0x2a0) == 1) {
            iVar8 = (int)uVar5;
          }
          iVar10 = iVar10 + iVar8;
          if (*(int *)(lVar1 + 0x2a0) == 2) {
            RVar6.m_i = (int)uVar5;
          }
          if (RVar6.m_i < RVar7.m_i) {
            RVar6.m_i = RVar7.m_i;
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < *(ulong *)(lVar1 + 0x298));
  }
  RVar7.m_i = iVar10;
  if (*(int *)(*(long *)&(this->super_QFrame).super_QWidget.field_0x8 + 0x2a0) == 1) {
    RVar7.m_i = RVar6.m_i;
    RVar6.m_i = iVar10;
  }
  QVar4.ht.m_i = RVar7.m_i;
  QVar4.wd.m_i = RVar6.m_i;
  return QVar4;
}

Assistant:

QSize QSplitter::minimumSizeHint() const
{
    Q_D(const QSplitter);
    ensurePolished();
    int l = 0;
    int t = 0;

    for (int i = 0; i < d->list.size(); ++i) {
        QSplitterLayoutStruct *s = d->list.at(i);
        if (!s || !s->widget)
            continue;
        if (s->widget->isHidden())
            continue;
        QSize widgetSize = qSmartMinSize(s->widget);
        if (widgetSize.isValid()) {
            l += d->pick(widgetSize);
            t = qMax(t, d->trans(widgetSize));
        }
        if (!s->handle || s->handle->isHidden())
            continue;
        QSize splitterSize = s->handle->sizeHint();
        if (splitterSize.isValid()) {
            l += d->pick(splitterSize);
            t = qMax(t, d->trans(splitterSize));
        }
    }
    return orientation() == Qt::Horizontal ? QSize(l, t) : QSize(t, l);
}